

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::Exception::SetWhat<char_const*&,char,int&,char,char_const(&)[30]>
          (Exception *this,ostringstream *oss,char **arg,char *args,int *args_1,char *args_2,
          char (*args_3) [30])

{
  char *in_RCX;
  ostringstream *in_RDX;
  ostream *in_RSI;
  char (*in_RDI) [30];
  int *in_R8;
  char *in_R9;
  
  std::operator<<(in_RSI,*(char **)in_RDX);
  SetWhat<char,int&,char,char_const(&)[30]>((Exception *)in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_RDI);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }